

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_index.cpp
# Opt level: O3

void __thiscall BamTools::IndexTool::~IndexTool(IndexTool *this)

{
  IndexSettings *pIVar1;
  pointer pcVar2;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__IndexTool_001f10c8;
  pIVar1 = this->m_settings;
  if ((pIVar1 != (IndexSettings *)0x0) &&
     (pcVar2 = (pIVar1->InputBamFilename)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pIVar1->InputBamFilename).field_2)) {
    operator_delete(pcVar2);
  }
  operator_delete(pIVar1);
  this->m_settings = (IndexSettings *)0x0;
  operator_delete(this->m_impl);
  this->m_impl = (IndexToolPrivate *)0x0;
  return;
}

Assistant:

IndexTool::~IndexTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}